

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O3

FT_Error T1_Size_Request(FT_Size t1size,FT_Size_Request req)

{
  undefined8 *puVar1;
  code *pcVar2;
  FT_Error FVar3;
  FT_Module pFVar4;
  long lVar5;
  
  puVar1 = *(undefined8 **)&t1size->face[3].units_per_EM;
  pFVar4 = FT_Get_Module((t1size->face->driver->root).library,"pshinter");
  if ((puVar1 == (undefined8 *)0x0 || pFVar4 == (FT_Module)0x0) ||
     (pcVar2 = (code *)*puVar1, pcVar2 == (code *)0x0)) {
    lVar5 = 0;
  }
  else {
    lVar5 = (*pcVar2)(pFVar4);
  }
  FVar3 = FT_Request_Metrics(t1size->face,req);
  if ((FVar3 == 0) && (lVar5 != 0)) {
    (**(code **)(lVar5 + 8))
              (t1size->internal->module_data,(t1size->metrics).x_scale,(t1size->metrics).y_scale,0,0
              );
  }
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Size_Request( FT_Size          t1size,     /* T1_Size */
                   FT_Size_Request  req )
  {
    FT_Error  error;

    T1_Size            size  = (T1_Size)t1size;
    PSH_Globals_Funcs  funcs = T1_Size_Get_Globals_Funcs( size );


    error = FT_Request_Metrics( size->root.face, req );
    if ( error )
      goto Exit;

    if ( funcs )
      funcs->set_scale( (PSH_Globals)t1size->internal->module_data,
                        size->root.metrics.x_scale,
                        size->root.metrics.y_scale,
                        0, 0 );

  Exit:
    return error;
  }